

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O3

void __thiscall CVmHashEntry::CVmHashEntry(CVmHashEntry *this,char *str,size_t len,int copy)

{
  char *__dest;
  
  this->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003227a0;
  this->nxt_ = (CVmHashEntry *)0x0;
  __dest = str;
  if (copy != 0) {
    __dest = (char *)operator_new__(len);
    memcpy(__dest,str,len);
  }
  this->str_ = __dest;
  this->len_ = len;
  this->field_0x20 = this->field_0x20 & 0xfe | (byte)copy & 1;
  return;
}

Assistant:

CVmHashEntry::CVmHashEntry(const char *str, size_t len, int copy)
{
    /* not linked into a list yet */
    nxt_ = 0;

    /* see if we can use the original string or need to make a private copy */
    if (copy)
    {
        char *buf;

        /* allocate space for a copy */
        buf = new char[len];

        /* copy it into our buffer */
        memcpy(buf, str, len * sizeof(*buf));

        /* remember it */
        str_ = buf;
    }
    else
    {
        /* we can use the original */
        str_ = str;
    }

    /* remember the length */
    len_ = len;

    /* remember whether or not we own the string */
    copy_ = copy;
}